

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

void process_text(CHAR_DATA *ch,char *text)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  PC_DATA *pPVar6;
  uint uVar7;
  ulong uVar8;
  char cVar9;
  char *pcVar10;
  char tbuf [4608];
  char obuf [9216];
  char rbuf [4608];
  char local_4838 [4608];
  char local_3638 [9216];
  char local_1238 [4616];
  
  bVar1 = str_cmp(text,"");
  if (!bVar1) {
    return;
  }
  bVar1 = str_cmp(text,"exit");
  if (bVar1) {
    bVar1 = str_cmp(text,"finish");
    if (!bVar1) {
      send_to_char("Saving changes and exiting...\n\r",ch);
      pPVar6 = ch->pcdata;
      if (pPVar6->end_fun != (DO_FUN *)0x0) {
        (*pPVar6->end_fun)(ch,pPVar6->entered_text);
        pPVar6 = ch->pcdata;
      }
      pPVar6->entering_text = false;
      pPVar6->end_fun = (DO_FUN *)0x0;
      return;
    }
    bVar1 = str_cmp(text,"backline");
    if (bVar1) {
      bVar1 = str_cmp(text,"show");
      if (bVar1) {
        if (*text != '\0') {
          local_3638[0] = '\0';
          sVar5 = strlen(text);
          if (0x50 < sVar5) {
            strcpy(local_4838,text);
            sVar5 = strlen(text);
            if (0x4f < sVar5) {
              uVar8 = 1;
              do {
                iVar4 = (int)uVar8;
                uVar7 = iVar4 * 0x50;
                uVar3 = 0;
                if (uVar7 != 0) {
                  uVar2 = uVar7;
                  do {
                    uVar3 = uVar2;
                    if (local_4838[uVar2] == ' ') break;
                    uVar2 = uVar2 - 1;
                    uVar3 = uVar7;
                  } while (iVar4 * 0x50 - 0xfU < uVar2);
                }
                cVar9 = local_4838[uVar3 + 1];
                uVar7 = uVar3;
                if (cVar9 != '\0') {
                  uVar2 = 0;
                  do {
                    local_1238[uVar2] = cVar9;
                    cVar9 = local_4838[uVar7 + 2];
                    uVar7 = uVar7 + 1;
                    uVar2 = uVar2 + 1;
                  } while (cVar9 != '\0');
                }
                local_1238[uVar7 - uVar3] = '\0';
                local_4838[uVar3] = '\n';
                local_4838[uVar3 + 1] = '\r';
                local_4838[uVar3 + 2] = '\0';
                strcat(local_4838,local_1238);
                uVar8 = (ulong)(iVar4 + 1);
              } while (uVar8 <= sVar5 / 0x50);
            }
            send_to_char("Over 80 characters, wrapping line.\n\r",ch);
          }
          pPVar6 = ch->pcdata;
          pcVar10 = pPVar6->entered_text;
          if (pcVar10 != (char *)0x0) {
            strcat(local_3638,pcVar10);
          }
          sVar5 = strlen(text);
          if (sVar5 < 0x50) {
            uVar8 = 0;
            do {
              if (text[uVar8] == '~') goto LAB_0027494b;
              uVar7 = (int)uVar8 + 1;
              uVar8 = (ulong)uVar7;
            } while (uVar7 <= (uint)sVar5);
            strcat(local_3638,text);
          }
          else {
            strcat(local_3638,local_4838);
            sVar5 = strlen(local_4838);
            uVar7 = 1;
            uVar8 = 0;
            do {
              if (local_4838[uVar8] == '~') goto LAB_0027494b;
              uVar8 = (ulong)uVar7;
              uVar7 = uVar7 + 1;
            } while (uVar8 <= sVar5);
          }
          sVar5 = strlen(local_3638);
          (local_3638 + sVar5)[0] = '\n';
          (local_3638 + sVar5)[1] = '\r';
          local_3638[sVar5 + 2] = '\0';
          sVar5 = strlen(local_3638);
          if (sVar5 < 0x2400) {
            free_pstring(pPVar6->entered_text);
            pcVar10 = palloc_string(local_3638);
            ch->pcdata->entered_text = pcVar10;
            pcVar10 = "Line added.";
          }
          else {
            pcVar10 = "String exceeds buffer.\n\r";
          }
          goto LAB_002749bc;
        }
        pcVar10 = "Add what?";
      }
      else {
        pcVar10 = ch->pcdata->entered_text;
      }
    }
    else {
      pPVar6 = ch->pcdata;
      pcVar10 = pPVar6->entered_text;
      if ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0')) {
        strcpy(local_3638,pcVar10);
        uVar8 = strlen(local_3638);
        if ((int)uVar8 != 0) {
          bVar1 = false;
          do {
            iVar4 = (int)uVar8;
            if (local_3638[uVar8 & 0xffffffff] == '\r') {
              if (bVar1) {
                local_3638[iVar4 + 1] = '\0';
                free_pstring(pPVar6->entered_text);
                pcVar10 = palloc_string(local_3638);
                ch->pcdata->entered_text = pcVar10;
                pcVar10 = "Line deleted.";
                goto LAB_002749bc;
              }
              iVar4 = iVar4 + -1;
              bVar1 = true;
            }
            uVar8 = (ulong)(iVar4 - 1U);
          } while (iVar4 - 1U != 0);
        }
        local_3638[0] = '\0';
        free_pstring(pPVar6->entered_text);
        pcVar10 = palloc_string(local_3638);
        ch->pcdata->entered_text = pcVar10;
        send_to_char("Line deleted.",ch);
        pcVar10 = ch->pcdata->entered_text;
        goto LAB_002749bc;
      }
      pcVar10 = "No lines left to remove.";
    }
  }
  else {
    pPVar6 = ch->pcdata;
    pPVar6->entering_text = false;
    *pPVar6->entered_text = '\0';
    ch->pcdata->end_fun = (DO_FUN *)0x0;
    pcVar10 = "Exiting without saving changes.\n\r";
  }
  send_to_char(pcVar10,ch);
  return;
LAB_0027494b:
  pcVar10 = "Tilde found, line will not be added.\n\r";
LAB_002749bc:
  send_to_char(pcVar10,ch);
  return;
}

Assistant:

void process_text(CHAR_DATA *ch, char *text)
{
	char obuf[MSL * 2], tbuf[MSL], rbuf[MSL];
	bool found= false;
	unsigned int len, rcount, i, iloc;

	if (!str_cmp(text, ""))
		return;

	if (!str_cmp(text, "exit"))
	{
		ch->pcdata->entering_text= false;
		ch->pcdata->entered_text[0] = '\0';
		ch->pcdata->end_fun = nullptr;

		send_to_char("Exiting without saving changes.\n\r", ch);
		return;
	}

	if (!str_cmp(text, "finish"))
	{
		send_to_char("Saving changes and exiting...\n\r", ch);

		if (ch->pcdata->end_fun)
			(*ch->pcdata->end_fun)(ch, ch->pcdata->entered_text);

		ch->pcdata->entering_text= false;
		ch->pcdata->end_fun = nullptr;
		return;
	}

	if (!str_cmp(text, "backline"))
	{
		if (ch->pcdata->entered_text == nullptr || ch->pcdata->entered_text[0] == '\0')
		{
			send_to_char("No lines left to remove.", ch);
			return;
		}

		strcpy(obuf, ch->pcdata->entered_text);

		for (len = strlen(obuf); len > 0; len--)
		{
			if (obuf[len] == '\r')
			{
				if (!found)
				{
					if (len > 0)
						len--;

					found = true;
				}
				else
				{
					obuf[len + 1] = '\0';

					free_pstring(ch->pcdata->entered_text);
					ch->pcdata->entered_text = palloc_string(obuf);

					send_to_char("Line deleted.", ch);
					return;
				}
			}
		}

		obuf[0] = '\0';

		free_pstring(ch->pcdata->entered_text);
		ch->pcdata->entered_text = palloc_string(obuf);

		send_to_char("Line deleted.", ch);
		send_to_char(ch->pcdata->entered_text, ch);
		return;
	}

	if (!str_cmp(text, "show"))
	{
		send_to_char(ch->pcdata->entered_text, ch);
		return;
	}

	if (text[0] != '\0')
	{
		obuf[0] = '\0';

		if (strlen(text) > 80)
		{
			sprintf(tbuf, "%s", text);

			for (i = 1; i <= strlen(text) / 80; i++)
			{
				for (rcount = 80 * i; rcount > (80 * i) - 15; rcount--)
				{
					if (tbuf[rcount] == ' ')
						break;
				}

				if (rcount <= (80 * i) - 15)
					rcount = 80 * i;

				for (iloc = rcount; tbuf[iloc + 1]; iloc++)
				{
					rbuf[iloc - rcount] = tbuf[iloc + 1];
				}

				rbuf[iloc - rcount] = '\0';
				tbuf[rcount] = '\n';
				tbuf[rcount + 1] = '\r';
				tbuf[rcount + 2] = '\0';
				strcat(tbuf, rbuf);
			}

			send_to_char("Over 80 characters, wrapping line.\n\r", ch);
		}

		if (ch->pcdata->entered_text)
			strcat(obuf, ch->pcdata->entered_text);

		if (strlen(text) < 80)
		{
			for (i = 0; i <= strlen(text); i++)
			{
				if (text[i] == '~')
				{
					send_to_char("Tilde found, line will not be added.\n\r", ch);
					return;
				}
			}

			strcat(obuf, text);
		}
		else
		{
			strcat(obuf, tbuf);

			for (i = 0; i <= strlen(tbuf); i++)
			{
				if (tbuf[i] == '~')
				{
					send_to_char("Tilde found, line will not be added.\n\r", ch);
					return;
				}
			}
		}

		strcat(obuf, "\n\r");

		if (strlen(obuf) >= MSL * 2)
		{
			send_to_char("String exceeds buffer.\n\r", ch);
			return;
		}

		free_pstring(ch->pcdata->entered_text);
		ch->pcdata->entered_text = palloc_string(obuf);
	}
	else if (text[0] == '\0')
	{
		send_to_char("Add what?", ch);
		return;
	}

	send_to_char("Line added.", ch);
	return;
}